

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall ThreadedReplayer::emergency_teardown(ThreadedReplayer *this)

{
  DatabaseInterface *pDVar1;
  
  flush_pipeline_cache(this);
  flush_validation_cache(this);
  pDVar1 = (this->validation_whitelist_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar1 != (DatabaseInterface *)0x0) {
    (*pDVar1->_vptr_DatabaseInterface[7])();
  }
  pDVar1 = (this->validation_blacklist_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar1 != (DatabaseInterface *)0x0) {
    (*pDVar1->_vptr_DatabaseInterface[7])();
    return;
  }
  return;
}

Assistant:

void emergency_teardown()
	{
#ifdef SIMULATE_UNSTABLE_DRIVER
		spurious_deadlock();
#endif
		flush_pipeline_cache();
		flush_validation_cache();
		if (validation_whitelist_db)
			validation_whitelist_db->flush();
		if (validation_blacklist_db)
			validation_blacklist_db->flush();
	}